

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O1

type __thiscall
duckdb::Deserializer::
Read<duckdb::optionally_owned_ptr<duckdb::ColumnDataCollection>,duckdb::ColumnDataCollection>
          (Deserializer *this)

{
  int iVar1;
  optional_ptr<duckdb::ColumnDataCollection,_true> extraout_RDX;
  Deserializer *in_RSI;
  type tVar2;
  element_type *local_28;
  element_type *local_20;
  
  local_28 = (element_type *)0x0;
  iVar1 = (*in_RSI->_vptr_Deserializer[10])();
  if ((char)iVar1 != '\0') {
    (*in_RSI->_vptr_Deserializer[6])();
    ColumnDataCollection::Deserialize((ColumnDataCollection *)&stack0xffffffffffffffe0,in_RSI);
    local_28 = local_20;
    local_20 = (element_type *)0x0;
    (*in_RSI->_vptr_Deserializer[7])();
  }
  (*in_RSI->_vptr_Deserializer[0xb])();
  this->_vptr_Deserializer = (_func_int **)local_28;
  *(element_type **)&this->deserialize_enum_from_string = local_28;
  tVar2.ptr.ptr = extraout_RDX.ptr;
  tVar2.owned.
  super_unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnDataCollection_*,_std::default_delete<duckdb::ColumnDataCollection>_>
  .super__Head_base<0UL,_duckdb::ColumnDataCollection_*,_false>._M_head_impl =
       (unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
       )(unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
         )this;
  return tVar2;
}

Assistant:

inline typename std::enable_if<is_optionally_owned_ptr<T>::value, T>::type Read() {
		return optionally_owned_ptr<ELEMENT_TYPE>(Read<unique_ptr<ELEMENT_TYPE>>());
	}